

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger_manager.cpp
# Opt level: O0

shared_ptr<Debugger> __thiscall
EmmyDebuggerManager::AddDebugger(EmmyDebuggerManager *this,lua_State *L)

{
  bool bVar1;
  pointer ppVar2;
  element_type *this_00;
  mutex_type *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Debugger> sVar3;
  pair<const_unsigned_long_long,_std::shared_ptr<Debugger>_> local_b0;
  lua_State *local_98;
  shared_ptr<Debugger> local_90;
  int local_7c;
  EmmyDebuggerManager *pEStack_78;
  int ret;
  lua_State *mainState;
  EmmyDebuggerManager *local_68;
  shared_ptr<Debugger> local_60;
  _Self local_50;
  _Self local_48;
  iterator it;
  EmmyDebuggerManager *local_30;
  UniqueIdentifyType identify;
  lock_guard<std::mutex> lock;
  lua_State *L_local;
  EmmyDebuggerManager *this_local;
  shared_ptr<Debugger> *debugger;
  
  lock._M_device = in_RDX;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&identify,(mutex_type *)&L->hook);
  local_30 = (EmmyDebuggerManager *)
             GetUniqueIdentify((EmmyDebuggerManager *)L,(lua_State *)lock._M_device);
  it._M_node._3_1_ = 0;
  std::shared_ptr<Debugger>::shared_ptr((shared_ptr<Debugger> *)this,(nullptr_t)0x0);
  local_48._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long_long,_std::shared_ptr<Debugger>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<Debugger>_>_>_>
       ::find((map<unsigned_long_long,_std::shared_ptr<Debugger>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<Debugger>_>_>_>
               *)(L + 1),(key_type_conflict *)&local_30);
  local_50._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long_long,_std::shared_ptr<Debugger>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<Debugger>_>_>_>
       ::end((map<unsigned_long_long,_std::shared_ptr<Debugger>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<Debugger>_>_>_>
              *)(L + 1));
  bVar1 = std::operator==(&local_48,&local_50);
  if (bVar1) {
    if (luaVersion == LUA_JIT) {
      pEStack_78 = (EmmyDebuggerManager *)0x0;
      local_7c = (*lua_pushthread)((lua_State *)lock._M_device);
      (*lua_settop)((lua_State *)lock._M_device,-2);
      if (local_7c == 1) {
        pEStack_78 = (EmmyDebuggerManager *)lock._M_device;
      }
      local_98 = L;
      std::make_shared<Debugger,lua_State*&,EmmyDebuggerManager*>
                ((lua_State **)&local_90,&stack0xffffffffffffff88);
      std::shared_ptr<Debugger>::operator=((shared_ptr<Debugger> *)this,&local_90);
      std::shared_ptr<Debugger>::~shared_ptr(&local_90);
    }
    else {
      local_68 = local_30;
      mainState = L;
      std::make_shared<Debugger,lua_State*,EmmyDebuggerManager*>((lua_State **)&local_60,&local_68);
      std::shared_ptr<Debugger>::operator=((shared_ptr<Debugger> *)this,&local_60);
      std::shared_ptr<Debugger>::~shared_ptr(&local_60);
    }
    std::pair<const_unsigned_long_long,_std::shared_ptr<Debugger>_>::
    pair<unsigned_long_long_&,_std::shared_ptr<Debugger>_&,_true>
              (&local_b0,(unsigned_long_long *)&local_30,(shared_ptr<Debugger> *)this);
    std::
    map<unsigned_long_long,_std::shared_ptr<Debugger>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<Debugger>_>_>_>
    ::insert((map<unsigned_long_long,_std::shared_ptr<Debugger>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<Debugger>_>_>_>
              *)(L + 1),&local_b0);
    std::pair<const_unsigned_long_long,_std::shared_ptr<Debugger>_>::~pair(&local_b0);
  }
  else {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_long_long,_std::shared_ptr<Debugger>_>_>::
             operator->(&local_48);
    std::shared_ptr<Debugger>::operator=((shared_ptr<Debugger> *)this,&ppVar2->second);
  }
  this_00 = std::__shared_ptr_access<Debugger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Debugger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       this);
  Debugger::SetCurrentState(this_00,(lua_State *)lock._M_device);
  it._M_node._3_1_ = 1;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&identify);
  sVar3.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Debugger>)sVar3.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Debugger> EmmyDebuggerManager::AddDebugger(lua_State* L)
{
	std::lock_guard<std::mutex> lock(debuggerMtx);

	auto identify = GetUniqueIdentify(L);

	std::shared_ptr<Debugger> debugger = nullptr;

	auto it = debuggers.find(identify);

	if (it == debuggers.end())
	{
		if (luaVersion != LuaVersion::LUA_JIT)
		{
			debugger = std::make_shared<Debugger>(reinterpret_cast<lua_State*>(identify), this);
		}
		else
		{
			// 如果首次add 的state不是main state，则main state视为空指针
			// 但不影响luajit附加调试和远程调试
			lua_State* mainState = nullptr;

			int ret = lua_pushthread(L);
			lua_pop(L, 1);
			if (ret == 1)
			{
				mainState = L;
			}

			debugger = std::make_shared<Debugger>(mainState, this);
		}
		debuggers.insert({identify, debugger});
	}
	else
	{
		debugger = it->second;
	}

	debugger->SetCurrentState(L);
	return debugger;
}